

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fwrite_weight_data(NetOptimize *this,Mat *data,FILE *bp)

{
  long lVar1;
  long lVar2;
  FILE *in_RDX;
  uchar padding [4];
  size_t nalign;
  int nwrite;
  Mat data_flattened;
  int p0;
  undefined4 local_7c;
  size_t local_78;
  int local_70;
  void *local_60;
  Allocator *in_stack_ffffffffffffffa8;
  undefined4 local_50;
  int in_stack_ffffffffffffffb4;
  Mat *in_stack_ffffffffffffffb8;
  int local_34;
  
  lVar1 = ftell(in_RDX);
  ncnn::Mat::reshape(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  fwrite(local_60,CONCAT44(in_stack_ffffffffffffffb4,local_50),(long)local_34,in_RDX);
  lVar2 = ftell(in_RDX);
  local_70 = (int)lVar2 - (int)lVar1;
  local_78 = ::alignSize((long)local_70,4);
  local_7c = 0;
  fwrite(&local_7c,1,local_78 - (long)local_70,in_RDX);
  ncnn::Mat::~Mat((Mat *)0x12337e);
  return 0;
}

Assistant:

int NetOptimize::fwrite_weight_data(const ncnn::Mat& data, FILE* bp)
{
    int p0 = ftell(bp);

    ncnn::Mat data_flattened = data.reshape(data.w * data.h * data.c);
    fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);

    // padding to 32bit align
    int nwrite = ftell(bp) - p0;
    size_t nalign = alignSize(nwrite, 4);
    unsigned char padding[4] = {0x00, 0x00, 0x00, 0x00};
    fwrite(padding, sizeof(unsigned char), nalign - nwrite, bp);

    return 0;
}